

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommands.cxx
# Opt level: O2

void GetScriptingCommands(cmState *state)

{
  allocator<char> local_99;
  string local_98;
  Command local_78;
  Command local_58;
  Command local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"break",&local_99);
  cmState::AddFlowControlCommand(state,&local_98,cmBreakCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"continue",&local_99);
  cmState::AddFlowControlCommand(state,&local_98,cmContinueCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"foreach",&local_99);
  cmState::AddFlowControlCommand(state,&local_98,cmForEachCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"function",&local_99);
  cmState::AddFlowControlCommand(state,&local_98,cmFunctionCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"if",&local_99);
  local_38.super__Function_base._M_functor._8_8_ = 0;
  local_38.super__Function_base._M_functor._M_unused._M_object = cmIfCommand;
  local_38._M_invoker =
       std::
       _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_bool_(*)(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
       ::_M_invoke;
  local_38.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_bool_(*)(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
       ::_M_manager;
  cmState::AddFlowControlCommand(state,&local_98,&local_38);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"macro",&local_99);
  cmState::AddFlowControlCommand(state,&local_98,cmMacroCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"return",&local_99);
  cmState::AddFlowControlCommand(state,&local_98,cmReturnCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"while",&local_99);
  local_58.super__Function_base._M_functor._8_8_ = 0;
  local_58.super__Function_base._M_functor._M_unused._M_object = cmWhileCommand;
  local_58._M_invoker =
       std::
       _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_bool_(*)(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
       ::_M_invoke;
  local_58.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_bool_(*)(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
       ::_M_manager;
  cmState::AddFlowControlCommand(state,&local_98,&local_58);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"block",&local_99);
  cmState::AddFlowControlCommand(state,&local_98,cmBlockCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"cmake_language",&local_99)
  ;
  local_78.super__Function_base._M_functor._8_8_ = 0;
  local_78.super__Function_base._M_functor._M_unused._M_object = cmCMakeLanguageCommand;
  local_78._M_invoker =
       std::
       _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_bool_(*)(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
       ::_M_invoke;
  local_78.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_bool_(*)(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
       ::_M_manager;
  cmState::AddBuiltinCommand(state,&local_98,&local_78);
  std::_Function_base::~_Function_base(&local_78.super__Function_base);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"cmake_minimum_required",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmCMakeMinimumRequired);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"cmake_path",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmCMakePathCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"cmake_policy",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmCMakePolicyCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"configure_file",&local_99)
  ;
  cmState::AddBuiltinCommand(state,&local_98,cmConfigureFileCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"exec_program",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmExecProgramCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"execute_process",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmExecuteProcessCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"file",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmFileCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"find_file",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmFindFile);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"find_library",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmFindLibrary);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"find_package",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmFindPackage);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"find_path",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmFindPath);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"find_program",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmFindProgram);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"get_cmake_property",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmGetCMakePropertyCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"get_directory_property",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmGetDirectoryPropertyCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"get_filename_component",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmGetFilenameComponentCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"get_property",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmGetPropertyCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"include",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmIncludeCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"include_guard",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmIncludeGuardCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"list",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmListCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"make_directory",&local_99)
  ;
  cmState::AddBuiltinCommand(state,&local_98,cmMakeDirectoryCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"mark_as_advanced",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmMarkAsAdvancedCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"math",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmMathCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"message",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmMessageCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"option",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmOptionCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"cmake_parse_arguments",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmParseArgumentsCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"separate_arguments",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmSeparateArgumentsCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"set",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmSetCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"set_directory_properties",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmSetDirectoryPropertiesCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"set_property",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmSetPropertyCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"site_name",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmSiteNameCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"string",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmStringCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"unset",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmUnsetCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"else",&local_99);
  cmState::AddUnexpectedFlowControlCommand
            (state,&local_98,
             "An ELSE command was found outside of a proper IF ENDIF structure. Or its arguments did not match the opening IF command."
            );
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"elseif",&local_99);
  cmState::AddUnexpectedFlowControlCommand
            (state,&local_98,"An ELSEIF command was found outside of a proper IF ENDIF structure.");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"endforeach",&local_99);
  cmState::AddUnexpectedFlowControlCommand
            (state,&local_98,
             "An ENDFOREACH command was found outside of a proper FOREACH ENDFOREACH structure. Or its arguments did not match the opening FOREACH command."
            );
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"endfunction",&local_99);
  cmState::AddUnexpectedFlowControlCommand
            (state,&local_98,
             "An ENDFUNCTION command was found outside of a proper FUNCTION ENDFUNCTION structure. Or its arguments did not match the opening FUNCTION command."
            );
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"endif",&local_99);
  cmState::AddUnexpectedFlowControlCommand
            (state,&local_98,
             "An ENDIF command was found outside of a proper IF ENDIF structure. Or its arguments did not match the opening IF command."
            );
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"endmacro",&local_99);
  cmState::AddUnexpectedFlowControlCommand
            (state,&local_98,
             "An ENDMACRO command was found outside of a proper MACRO ENDMACRO structure. Or its arguments did not match the opening MACRO command."
            );
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"endwhile",&local_99);
  cmState::AddUnexpectedFlowControlCommand
            (state,&local_98,
             "An ENDWHILE command was found outside of a proper WHILE ENDWHILE structure. Or its arguments did not match the opening WHILE command."
            );
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"endblock",&local_99);
  cmState::AddUnexpectedFlowControlCommand
            (state,&local_98,
             "An ENDBLOCK command was found outside of a proper BLOCK ENDBLOCK structure.");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"cmake_host_system_information",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmCMakeHostSystemInformationCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"load_cache",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmLoadCacheCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"remove",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmRemoveCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"variable_watch",&local_99)
  ;
  cmState::AddBuiltinCommand(state,&local_98,cmVariableWatchCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"write_file",&local_99);
  cmState::AddBuiltinCommand(state,&local_98,cmWriteFileCommand);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"build_name",&local_99);
  cmState::AddDisallowedCommand
            (state,&local_98,cmBuildNameCommand,CMP0036,
             "The build_name command should not be called; see CMP0036.");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"use_mangled_mesa",&local_99);
  cmState::AddDisallowedCommand
            (state,&local_98,cmUseMangledMesaCommand,CMP0030,
             "The use_mangled_mesa command should not be called; see CMP0030.");
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void GetScriptingCommands(cmState* state)
{
  state->AddFlowControlCommand("break", cmBreakCommand);
  state->AddFlowControlCommand("continue", cmContinueCommand);
  state->AddFlowControlCommand("foreach", cmForEachCommand);
  state->AddFlowControlCommand("function", cmFunctionCommand);
  state->AddFlowControlCommand("if", cmIfCommand);
  state->AddFlowControlCommand("macro", cmMacroCommand);
  state->AddFlowControlCommand("return", cmReturnCommand);
  state->AddFlowControlCommand("while", cmWhileCommand);
  state->AddFlowControlCommand("block", cmBlockCommand);

  state->AddBuiltinCommand("cmake_language", cmCMakeLanguageCommand);
  state->AddBuiltinCommand("cmake_minimum_required", cmCMakeMinimumRequired);
  state->AddBuiltinCommand("cmake_path", cmCMakePathCommand);
  state->AddBuiltinCommand("cmake_policy", cmCMakePolicyCommand);
  state->AddBuiltinCommand("configure_file", cmConfigureFileCommand);
  state->AddBuiltinCommand("exec_program", cmExecProgramCommand);
  state->AddBuiltinCommand("execute_process", cmExecuteProcessCommand);
  state->AddBuiltinCommand("file", cmFileCommand);
  state->AddBuiltinCommand("find_file", cmFindFile);
  state->AddBuiltinCommand("find_library", cmFindLibrary);
  state->AddBuiltinCommand("find_package", cmFindPackage);
  state->AddBuiltinCommand("find_path", cmFindPath);
  state->AddBuiltinCommand("find_program", cmFindProgram);
  state->AddBuiltinCommand("get_cmake_property", cmGetCMakePropertyCommand);
  state->AddBuiltinCommand("get_directory_property",
                           cmGetDirectoryPropertyCommand);
  state->AddBuiltinCommand("get_filename_component",
                           cmGetFilenameComponentCommand);
  state->AddBuiltinCommand("get_property", cmGetPropertyCommand);
  state->AddBuiltinCommand("include", cmIncludeCommand);
  state->AddBuiltinCommand("include_guard", cmIncludeGuardCommand);
  state->AddBuiltinCommand("list", cmListCommand);
  state->AddBuiltinCommand("make_directory", cmMakeDirectoryCommand);
  state->AddBuiltinCommand("mark_as_advanced", cmMarkAsAdvancedCommand);
  state->AddBuiltinCommand("math", cmMathCommand);
  state->AddBuiltinCommand("message", cmMessageCommand);
  state->AddBuiltinCommand("option", cmOptionCommand);
  state->AddBuiltinCommand("cmake_parse_arguments", cmParseArgumentsCommand);
  state->AddBuiltinCommand("separate_arguments", cmSeparateArgumentsCommand);
  state->AddBuiltinCommand("set", cmSetCommand);
  state->AddBuiltinCommand("set_directory_properties",
                           cmSetDirectoryPropertiesCommand);
  state->AddBuiltinCommand("set_property", cmSetPropertyCommand);
  state->AddBuiltinCommand("site_name", cmSiteNameCommand);
  state->AddBuiltinCommand("string", cmStringCommand);
  state->AddBuiltinCommand("unset", cmUnsetCommand);

  state->AddUnexpectedFlowControlCommand(
    "else",
    "An ELSE command was found outside of a proper "
    "IF ENDIF structure. Or its arguments did not match "
    "the opening IF command.");
  state->AddUnexpectedFlowControlCommand(
    "elseif",
    "An ELSEIF command was found outside of a proper "
    "IF ENDIF structure.");
  state->AddUnexpectedFlowControlCommand(
    "endforeach",
    "An ENDFOREACH command was found outside of a proper "
    "FOREACH ENDFOREACH structure. Or its arguments did "
    "not match the opening FOREACH command.");
  state->AddUnexpectedFlowControlCommand(
    "endfunction",
    "An ENDFUNCTION command was found outside of a proper "
    "FUNCTION ENDFUNCTION structure. Or its arguments did not "
    "match the opening FUNCTION command.");
  state->AddUnexpectedFlowControlCommand(
    "endif",
    "An ENDIF command was found outside of a proper "
    "IF ENDIF structure. Or its arguments did not match "
    "the opening IF command.");
  state->AddUnexpectedFlowControlCommand(
    "endmacro",
    "An ENDMACRO command was found outside of a proper "
    "MACRO ENDMACRO structure. Or its arguments did not "
    "match the opening MACRO command.");
  state->AddUnexpectedFlowControlCommand(
    "endwhile",
    "An ENDWHILE command was found outside of a proper "
    "WHILE ENDWHILE structure. Or its arguments did not "
    "match the opening WHILE command.");
  state->AddUnexpectedFlowControlCommand(
    "endblock",
    "An ENDBLOCK command was found outside of a proper "
    "BLOCK ENDBLOCK structure.");

#if !defined(CMAKE_BOOTSTRAP)
  state->AddBuiltinCommand("cmake_host_system_information",
                           cmCMakeHostSystemInformationCommand);
  state->AddBuiltinCommand("load_cache", cmLoadCacheCommand);
  state->AddBuiltinCommand("remove", cmRemoveCommand);
  state->AddBuiltinCommand("variable_watch", cmVariableWatchCommand);
  state->AddBuiltinCommand("write_file", cmWriteFileCommand);

  state->AddDisallowedCommand(
    "build_name", cmBuildNameCommand, cmPolicies::CMP0036,
    "The build_name command should not be called; see CMP0036.");
  state->AddDisallowedCommand(
    "use_mangled_mesa", cmUseMangledMesaCommand, cmPolicies::CMP0030,
    "The use_mangled_mesa command should not be called; see CMP0030.");

#endif
}